

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

void __thiscall
pbrt::StratifiedSampler::StartPixelSample(StratifiedSampler *this,Point2i *p,int index,int dim)

{
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = p->super_Tuple2<pbrt::Point2,_int>;
  this->sampleIndex = index;
  this->dimension = dim;
  RNG::SetSequence(&this->rng,
                   (ulong)(uint)this->seed << 0x20 |
                   (long)(p->super_Tuple2<pbrt::Point2,_int>).y * 0x10000 +
                   (long)(p->super_Tuple2<pbrt::Point2,_int>).x);
  RNG::Advance(&this->rng,(long)this->dimension + (long)this->sampleIndex * 0x10000);
  return;
}

Assistant:

PBRT_CPU_GPU
    void StartPixelSample(const Point2i &p, int index, int dim) {
        pixel = p;
        sampleIndex = index;
        dimension = dim;
        rng.SetSequence((p.x + p.y * 65536) | (uint64_t(seed) << 32));
        rng.Advance(sampleIndex * 65536 + dimension);
    }